

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pfx_locks.c
# Opt level: O0

void * rec_val(pfx_table *pfxt)

{
  __pid_t _Var1;
  uint32_t uVar2;
  int iVar3;
  long in_FS_OFFSET;
  uint32_t local_50;
  uint32_t i;
  int tid;
  pfx_table *pfxt_local;
  pfxv_state res;
  pfx_record rec;
  
  rec.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  _Var1 = getpid();
  rec.prefix.u.addr6.addr[2]._0_1_ = 0x20;
  rec.prefix.u.addr6.addr[2]._1_1_ = 0x20;
  res = BGP_PFXV_STATE_VALID;
  rec.asn = 0;
  printf("validating..\n");
  for (local_50 = max_i; min_i <= local_50; local_50 = local_50 - 1) {
    rec.prefix.u.addr6.addr[2]._0_1_ = 0x20;
    rec.prefix.u.addr6.addr[2]._1_1_ = 0x20;
    res = BGP_PFXV_STATE_VALID;
    rec.asn = htonl(local_50);
    pfx_table_validate(pfxt,_Var1 % 2,(lrtr_ip_addr *)&res,rec.prefix.u.addr6.addr[2]._0_1_,
                       (pfxv_state *)((long)&pfxt_local + 4));
    pfx_table_validate(pfxt,_Var1 % 2 + 1,(lrtr_ip_addr *)&res,rec.prefix.u.addr6.addr[2]._0_1_,
                       (pfxv_state *)((long)&pfxt_local + 4));
    rec.prefix.u.addr6.addr[2]._0_1_ = 0x80;
    rec.prefix.u.addr6.addr[2]._1_1_ = 0x80;
    res = BGP_PFXV_STATE_NOT_FOUND;
    rec.prefix.ver = min_i - LRTR_IPV6;
    uVar2 = htonl(local_50);
    rec.asn = uVar2 - 1;
    pfx_table_validate(pfxt,_Var1 % 2 + 1,(lrtr_ip_addr *)&res,rec.prefix.u.addr6.addr[2]._0_1_,
                       (pfxv_state *)((long)&pfxt_local + 4));
    iVar3 = rand();
    usleep(iVar3 / 0x6666666);
  }
  if (*(rtr_socket **)(in_FS_OFFSET + 0x28) == rec.socket) {
    return (void *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

static void *rec_val(struct pfx_table *pfxt)
{
	const int tid = getpid();
	struct pfx_record rec;
	enum pfxv_state res;

	rec.min_len = 32;
	rec.max_len = 32;
	rec.prefix.ver = LRTR_IPV4;
	rec.prefix.u.addr4.addr = 0;
	printf("validating..\n");
	for (uint32_t i = max_i; i >= min_i; i--) {
		rec.min_len = 32;
		rec.max_len = 32;
		rec.prefix.ver = LRTR_IPV4;
		rec.prefix.u.addr4.addr = htonl(i);
		pfx_table_validate(pfxt, (tid % 2), &rec.prefix, rec.min_len, &res);
		pfx_table_validate(pfxt, (tid % 2) + 1, &rec.prefix, rec.min_len, &res);

		rec.min_len = 128;
		rec.max_len = 128;
		rec.prefix.ver = LRTR_IPV6;
		rec.prefix.u.addr6.addr[1] = min_i + 0xFFFFFFFF;
		rec.prefix.u.addr6.addr[0] = htonl(i) + 0xFFFFFFFF;

		pfx_table_validate(pfxt, (tid % 2) + 1, &rec.prefix, rec.min_len, &res);
		usleep(rand() / (RAND_MAX / 20));
	}

	return NULL;
}